

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O0

ref<aphy::collision_shape>
aphy::
makeObjectWithInterface<aphy::collision_shape,APhyBullet::BulletCollisionShape,btBvhTriangleMeshShape*>
          (btBvhTriangleMeshShape *args)

{
  ref_counter<aphy::collision_shape> *this;
  pointer theCounter;
  btCollisionShape *in_RDI;
  unique_ptr<aphy::ref_counter<aphy::collision_shape>,_std::default_delete<aphy::ref_counter<aphy::collision_shape>_>_>
  counter;
  unique_ptr<APhyBullet::BulletCollisionShape,_std::default_delete<APhyBullet::BulletCollisionShape>_>
  object;
  pointer in_stack_ffffffffffffffa8;
  unique_ptr<APhyBullet::BulletCollisionShape,_std::default_delete<APhyBullet::BulletCollisionShape>_>
  *in_stack_ffffffffffffffb0;
  btCollisionShape *this_00;
  ref_counter<aphy::collision_shape> local_30 [2];
  
  this_00 = in_RDI;
  ::operator_new(0x20);
  APhyBullet::BulletCollisionShape::BulletCollisionShape
            ((BulletCollisionShape *)this_00,in_RDI,
             (APhyBulletCollisionShapeType)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  std::
  unique_ptr<APhyBullet::BulletCollisionShape,std::default_delete<APhyBullet::BulletCollisionShape>>
  ::unique_ptr<std::default_delete<APhyBullet::BulletCollisionShape>,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this = (ref_counter<aphy::collision_shape> *)::operator_new(0x18);
  std::
  unique_ptr<APhyBullet::BulletCollisionShape,_std::default_delete<APhyBullet::BulletCollisionShape>_>
  ::release((unique_ptr<APhyBullet::BulletCollisionShape,_std::default_delete<APhyBullet::BulletCollisionShape>_>
             *)0x131008);
  ref_counter<aphy::collision_shape>::ref_counter
            (this,&in_stack_ffffffffffffffa8->super_collision_shape);
  std::
  unique_ptr<aphy::ref_counter<aphy::collision_shape>,std::default_delete<aphy::ref_counter<aphy::collision_shape>>>
  ::unique_ptr<std::default_delete<aphy::ref_counter<aphy::collision_shape>>,void>
            ((unique_ptr<aphy::ref_counter<aphy::collision_shape>,_std::default_delete<aphy::ref_counter<aphy::collision_shape>_>_>
              *)this,local_30);
  theCounter = std::
               unique_ptr<aphy::ref_counter<aphy::collision_shape>,_std::default_delete<aphy::ref_counter<aphy::collision_shape>_>_>
               ::release((unique_ptr<aphy::ref_counter<aphy::collision_shape>,_std::default_delete<aphy::ref_counter<aphy::collision_shape>_>_>
                          *)0x131033);
  ref<aphy::collision_shape>::ref((ref<aphy::collision_shape> *)in_RDI,theCounter);
  std::
  unique_ptr<aphy::ref_counter<aphy::collision_shape>,_std::default_delete<aphy::ref_counter<aphy::collision_shape>_>_>
  ::~unique_ptr((unique_ptr<aphy::ref_counter<aphy::collision_shape>,_std::default_delete<aphy::ref_counter<aphy::collision_shape>_>_>
                 *)this);
  std::
  unique_ptr<APhyBullet::BulletCollisionShape,_std::default_delete<APhyBullet::BulletCollisionShape>_>
  ::~unique_ptr((unique_ptr<APhyBullet::BulletCollisionShape,_std::default_delete<APhyBullet::BulletCollisionShape>_>
                 *)this);
  return (ref<aphy::collision_shape>)(Counter *)this_00;
}

Assistant:

inline ref<I> makeObjectWithInterface(Args... args)
{
    std::unique_ptr<T> object(new T(args...));
    std::unique_ptr<ref_counter<I>> counter(new ref_counter<I> (object.release()));
    return ref<I> (counter.release());
}